

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::AffineTransform::forward_impl
          (AffineTransform *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  size_type sVar1;
  const_reference ppTVar2;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *other;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *pMVar3;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  bool bVar4;
  uint b_1;
  uint i;
  uint b;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  uint uVar5;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  Tensor *in_stack_fffffffffffffde8;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffdf0;
  Tensor *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  NoAlias<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
  in_stack_fffffffffffffe08;
  uint local_16c;
  uint local_bc;
  uint local_74;
  
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if ((sVar1 & 1) != 1) {
    __assert_fail("xs.size() % 2 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                  ,0x5fb,
                  "virtual void cnn::AffineTransform::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                 );
  }
  sVar1 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size(in_RSI);
  if (sVar1 == 1) {
    ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    *(float **)(in_RDX + 0x28) = (*ppTVar2)->v;
  }
  else {
    if (*(int *)(in_RDX + 0x20) != 1) {
      __assert_fail("fx.d.bd == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x608,
                    "virtual void cnn::AffineTransform::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    if ((*(uint *)(in_RDX + 0x20) < 2) ||
       (ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                            (in_RSI,0), ((*ppTVar2)->d).bd != 1)) {
      for (local_74 = 0; local_74 < *(uint *)(in_RDX + 0x20); local_74 = local_74 + 1) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0)
        ;
        Tensor::batch_matrix
                  ((Tensor *)in_stack_fffffffffffffe08.m_expression,in_stack_fffffffffffffe04);
        Tensor::batch_matrix
                  ((Tensor *)in_stack_fffffffffffffe08.m_expression,in_stack_fffffffffffffe04);
        Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>::operator=
                  ((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdc8);
      }
    }
    else {
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
      Tensor::vec(in_stack_fffffffffffffde8);
      Tensor::rowcol_matrix((Tensor *)in_stack_fffffffffffffe08.m_expression);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      colwise((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      Eigen::VectorwiseOp<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,0>::
      operator=((VectorwiseOp<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffdf8);
    }
    local_bc = 1;
    while( true ) {
      other = (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)(ulong)local_bc;
      pMVar3 = (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size
                            (in_RSI);
      if (pMVar3 <= other) break;
      ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                          (in_RSI,(ulong)local_bc);
      if (((*ppTVar2)->d).bd == 1) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                  (in_RSI,(ulong)local_bc);
        Tensor::operator*(in_stack_fffffffffffffdf8);
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                  (in_RSI,(ulong)(local_bc + 1));
        Tensor::colbatch_matrix((Tensor *)in_stack_fffffffffffffe08.m_expression);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)in_stack_fffffffffffffde8,other);
        Tensor::colbatch_matrix((Tensor *)in_stack_fffffffffffffe08.m_expression);
        Eigen::
        MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
        noalias((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)in_stack_fffffffffffffdc8);
        Eigen::
        NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
        ::operator+=(in_stack_fffffffffffffdf0,
                     (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                      *)in_stack_fffffffffffffde8);
      }
      else {
        ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                            (in_RSI,(ulong)(local_bc + 1));
        bVar4 = true;
        if (((*ppTVar2)->d).bd != 1) {
          ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
                    operator[](in_RSI,(ulong)(local_bc + 1));
          uVar5 = ((*ppTVar2)->d).bd;
          ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
                    operator[](in_RSI,(ulong)local_bc);
          bVar4 = uVar5 == ((*ppTVar2)->d).bd;
        }
        if (!bVar4) {
          __assert_fail("xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                        ,0x616,
                        "virtual void cnn::AffineTransform::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                       );
        }
        local_16c = 0;
        while (uVar5 = local_16c,
              ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::
                        operator[](in_RSI,(ulong)local_bc), uVar5 < ((*ppTVar2)->d).bd) {
          std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                    (in_RSI,(ulong)local_bc);
          Tensor::batch_matrix
                    ((Tensor *)in_stack_fffffffffffffe08.m_expression,in_stack_fffffffffffffe04);
          std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                    (in_RSI,(ulong)(local_bc + 1));
          Tensor::batch_matrix
                    ((Tensor *)in_stack_fffffffffffffe08.m_expression,in_stack_fffffffffffffe04);
          Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
          operator*((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_fffffffffffffde8,other);
          Tensor::batch_matrix
                    ((Tensor *)in_stack_fffffffffffffe08.m_expression,in_stack_fffffffffffffe04);
          in_stack_fffffffffffffe08 =
               Eigen::
               MatrixBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
               ::noalias(in_stack_fffffffffffffdc8);
          Eigen::
          NoAlias<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
          ::operator+=(in_stack_fffffffffffffdf0,
                       (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                        *)in_stack_fffffffffffffde8);
          local_16c = local_16c + 1;
        }
      }
      local_bc = local_bc + 2;
    }
  }
  return;
}

Assistant:

void AffineTransform::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() % 2 == 1);
  if (xs.size() == 1) {
    fx.v = xs[0]->v;
    return;
  } else {
#if HAVE_CUDA
    for (unsigned i = 1; i < xs.size(); i += 2)
      // fx = (acc_sclar)*fx + xs[0] * xs[1]
      CUDAMatrixMultiply(*xs[i], *xs[i + 1], fx, (i == 1) ? kSCALAR_ZERO : kSCALAR_ONE);
    assert(fx.d.bd == 1);
    assert(xs[0]->d.bd == 1);
    CUBLAS_CHECK(cublasSaxpy(cublas_handle, fx.d.size(), kSCALAR_ONE, xs[0]->v, 1, fx.v, 1));
#else
    assert(fx.d.bd == 1);
    // Add, using broadcasting or not
    if(fx.d.bd > 1 && xs[0]->d.bd == 1) {
      fx.rowcol_matrix().colwise() = xs[0]->vec();
    } else {
      for(unsigned b = 0; b < fx.d.bd; ++b)
        fx.batch_matrix(b) = xs[0]->batch_matrix(b);
    }

    // Multiply
    for (unsigned i = 1; i < xs.size(); i += 2) {
      if(xs[i]->d.bd == 1) {
        fx.colbatch_matrix().noalias() += **xs[i] * xs[i+1]->colbatch_matrix();
      } else {
        assert(xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd);
        for(unsigned b = 0; b < xs[i]->d.bd; ++b)
          fx.batch_matrix(b).noalias() += xs[i]->batch_matrix(b) * xs[i+1]->batch_matrix(b);
      }
    }

#endif
  }
}